

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O1

void __thiscall banksia::ChessBoard::checkEnpassant(ChessBoard *this)

{
  uint uVar1;
  
  uVar1 = this->enpassant & 0xfffffff8;
  if (uVar1 != 0x28 && uVar1 != 0x10) {
    this->enpassant = -1;
  }
  return;
}

Assistant:

void ChessBoard::checkEnpassant() {
    if ((enpassant >= 16 && enpassant < 24) || (enpassant >= 40 && enpassant < 48))  {
        return;
    }
    enpassant = -1;
}